

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDerivedProfileDef::~IfcDerivedProfileDef(IfcDerivedProfileDef *this)

{
  Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pMVar1;
  undefined1 *puVar2;
  LazyObject *pLVar3;
  size_type *psVar4;
  
  *(undefined ***)&this[-1].super_IfcProfileDef.field_0x60 = &PTR__IfcDerivedProfileDef_00964b88;
  *(undefined ***)((long)&(this->super_IfcProfileDef).ProfileName.ptr.field_2 + 8) =
       &PTR__IfcDerivedProfileDef_00964bd8;
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcDerivedProfileDef_00964bb0;
  puVar2 = *(undefined1 **)
            &(this->super_IfcProfileDef).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x20;
  pMVar1 = &(this->super_IfcProfileDef).ProfileName;
  if ((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      puVar2 != pMVar1) {
    operator_delete(puVar2,(ulong)((pMVar1->ptr)._M_dataplus._M_p + 1));
  }
  *(undefined8 *)&this[-1].super_IfcProfileDef.field_0x60 = 0x964c00;
  *(undefined8 *)((long)&(this->super_IfcProfileDef).ProfileName.ptr.field_2 + 8) = 0x964c28;
  puVar2 = *(undefined1 **)((long)&this[-1].Label.ptr.field_2 + 8);
  if (puVar2 != &this[-1].field_0xa0) {
    operator_delete(puVar2,*(long *)&this[-1].field_0xa0 + 1);
  }
  pLVar3 = this[-1].Operator.obj;
  psVar4 = &this[-1].Label.ptr._M_string_length;
  if (pLVar3 != (LazyObject *)psVar4) {
    operator_delete(pLVar3,*psVar4 + 1);
  }
  operator_delete(&this[-1].super_IfcProfileDef.field_0x60,0xb8);
  return;
}

Assistant:

IfcDerivedProfileDef() : Object("IfcDerivedProfileDef") {}